

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_wString __thiscall
ON_SubDEdgeSharpness::ToPercentageText(ON_SubDEdgeSharpness *this,bool bOrderMinToMax)

{
  float fVar1;
  bool bVar2;
  byte bVar3;
  byte in_DL;
  undefined7 in_register_00000031;
  ON_SubDEdgeSharpness *this_00;
  double sharpness;
  ON_SubDEdgeSharpness local_40;
  ON_wString local_38;
  ON_SubDEdgeSharpness local_30;
  ON_wString local_28;
  double local_20;
  
  this_00 = (ON_SubDEdgeSharpness *)CONCAT71(in_register_00000031,bOrderMinToMax);
  bVar2 = IsValid(this_00);
  if (bVar2) {
    bVar2 = IsConstant(this_00);
    fVar1 = this_00->m_edge_sharpness[0];
    if (!bVar2) {
      bVar3 = (this_00->m_edge_sharpness[1] <= fVar1 && fVar1 != this_00->m_edge_sharpness[1]) &
              in_DL;
      local_20 = (double)this_00->m_edge_sharpness[bVar3 ^ 1];
      ToPercentageText(&local_30,(double)this_00->m_edge_sharpness[bVar3]);
      ON_wString::ON_wString(&local_38,"-");
      ON_wString::operator+(&local_28,(ON_wString *)&local_30);
      ToPercentageText(&local_40,local_20);
      ON_wString::operator+((ON_wString *)this,&local_28);
      ON_wString::~ON_wString((ON_wString *)&local_40);
      ON_wString::~ON_wString(&local_28);
      ON_wString::~ON_wString(&local_38);
      ON_wString::~ON_wString((ON_wString *)&local_30);
      return (ON_wString)(wchar_t *)this;
    }
    sharpness = (double)fVar1;
  }
  else if (((this_00->m_edge_sharpness[0] != 5.0) || (this_00->m_edge_sharpness[1] != 5.0)) ||
          (sharpness = 5.0, NAN(this_00->m_edge_sharpness[1]))) {
    sharpness = ON_DBL_QNAN;
  }
  ToPercentageText(this,sharpness);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubDEdgeSharpness::ToPercentageText(bool bOrderMinToMax) const
{
  if (IsValid())
  {
    if ( IsConstant() )
      return ON_SubDEdgeSharpness::ToPercentageText(EndSharpness(0));
    const int i0 = (bOrderMinToMax && (EndSharpness(0) > EndSharpness(1))) ? 1 : 0;
    const double s0 = EndSharpness(i0);
    const double s1 = EndSharpness(1-i0);
    return
      ON_SubDEdgeSharpness::ToPercentageText(s0)
      + ON_wString("-")
      + ON_SubDEdgeSharpness::ToPercentageText(s1);
  }

  if (IsCrease())
    return ON_SubDEdgeSharpness::ToPercentageText(ON_SubDEdgeSharpness::CreaseValue);

  // invalid sharpness
  return ON_SubDEdgeSharpness::ToPercentageText(ON_DBL_QNAN);
}